

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O1

any __thiscall
cs_impl::any::make<std::pair<cs_impl::any,cs_impl::any>,cs_impl::any,cs_impl::any>
          (any *this,any *args,any *args_1)

{
  baseHolder *pbVar1;
  proxy *ppVar2;
  
  if ((DAT_0025e9b0 == 0) || (cs::global_thread_counter != 0)) {
    pbVar1 = (baseHolder *)operator_new(0x18);
  }
  else {
    pbVar1 = *(baseHolder **)(&holder<cs::type_id>::allocator + DAT_0025e9b0 * 8);
    DAT_0025e9b0 = DAT_0025e9b0 + -1;
  }
  pbVar1->_vptr_baseHolder = (_func_int **)&PTR__holder_00254ef0;
  pbVar1[1]._vptr_baseHolder = (_func_int **)0x0;
  pbVar1[1]._vptr_baseHolder = (_func_int **)args->mDat;
  args->mDat = (proxy *)0x0;
  pbVar1[2]._vptr_baseHolder = (_func_int **)0x0;
  pbVar1[2]._vptr_baseHolder = (_func_int **)args_1->mDat;
  args_1->mDat = (proxy *)0x0;
  if ((DAT_0025fe20 == 0) || (cs::global_thread_counter != 0)) {
    ppVar2 = (proxy *)operator_new(0x18);
  }
  else {
    ppVar2 = (proxy *)(&cs::null_pointer)[DAT_0025fe20];
    DAT_0025fe20 = DAT_0025fe20 + -1;
  }
  ppVar2->is_rvalue = false;
  ppVar2->protect_level = 0;
  ppVar2->refcount = 1;
  ppVar2->data = pbVar1;
  this->mDat = ppVar2;
  return (any)(proxy *)this;
}

Assistant:

static any make(ArgsT &&...args)
		{
			return any(allocator.alloc(1, holder<T>::allocator.alloc(std::forward<ArgsT>(args)...)));
		}